

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O3

int __thiscall
CVmObjDate::getp_addInterval(CVmObjDate *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  vm_obj_id_t vVar2;
  undefined4 uVar3;
  int32_t dayno;
  vm_obj_id_t vVar4;
  long lVar5;
  vm_val_t *this_00;
  bool bVar6;
  double dVar7;
  vm_val_t ele;
  caldate_t cd;
  double local_78;
  vm_val_t local_70;
  caldate_t local_5c;
  long local_50;
  vm_val_t *local_48;
  vm_val_t local_40;
  
  if (oargc == (uint *)0x0) {
    lVar5 = 0;
  }
  else {
    lVar5 = (long)(int)*oargc;
  }
  if (getp_addInterval(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_addInterval();
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,oargc,&getp_addInterval::desc);
  if (iVar1 == 0) {
    this_00 = sp_ + -1;
    iVar1 = vm_val_t::is_listlike(this_00);
    if (iVar1 == 0) {
      err_throw(0x900);
    }
    local_50 = lVar5;
    local_48 = retval;
    caldate_t::set_dayno(&local_5c,*(int32_t *)(this->super_CVmObject).ext_);
    local_78 = (double)*(int *)((this->super_CVmObject).ext_ + 4);
    vVar2 = vm_val_t::ll_length(this_00);
    if (0 < (int)vVar2) {
      vVar4 = 1;
      do {
        local_40.typ = VM_INT;
        local_40.val.obj = vVar4;
        vm_val_t::ll_index(this_00,&local_70,&local_40);
        if (local_70.typ == VM_NIL) goto switchD_00251553_default;
        switch(vVar4) {
        case 1:
          uVar3 = local_70.val.obj;
          if (local_70.typ != VM_INT) {
            uVar3 = vm_val_t::nonint_num_to_int(&local_70);
          }
          local_5c.y = local_5c.y + uVar3;
          break;
        case 2:
          uVar3 = local_70.val.obj;
          if (local_70.typ != VM_INT) {
            uVar3 = vm_val_t::nonint_num_to_int(&local_70);
          }
          local_5c.m = local_5c.m + uVar3;
          break;
        case 3:
          uVar3 = local_70.val.obj;
          if (local_70.typ != VM_INT) {
            uVar3 = vm_val_t::nonint_num_to_int(&local_70);
          }
          local_5c.d = local_5c.d + uVar3;
          break;
        case 4:
          if (local_70.typ == VM_INT) {
            dVar7 = (double)local_70.val.intval;
          }
          else {
            dVar7 = vm_val_t::nonint_num_to_double(&local_70);
          }
          dVar7 = dVar7 * 60.0 * 60.0;
          goto LAB_0025160b;
        case 5:
          if (local_70.typ == VM_INT) {
            dVar7 = (double)local_70.val.intval;
          }
          else {
            dVar7 = vm_val_t::nonint_num_to_double(&local_70);
          }
          dVar7 = dVar7 * 60.0;
          goto LAB_0025160b;
        case 6:
          if (local_70.typ == VM_INT) {
            dVar7 = (double)local_70.val.intval;
          }
          else {
            dVar7 = vm_val_t::nonint_num_to_double(&local_70);
          }
LAB_0025160b:
          local_78 = local_78 + dVar7 * 1000.0;
        }
switchD_00251553_default:
        bVar6 = vVar4 != vVar2;
        vVar4 = vVar4 + 1;
      } while (bVar6);
    }
    dVar7 = floor(local_78 / 86400000.0);
    if ((2147483647.0 < (double)local_5c.d + dVar7) || ((double)local_5c.d + dVar7 < -2147483648.0))
    {
      err_throw(0x7e7);
    }
    local_5c.d = local_5c.d + (int)dVar7;
    dayno = caldate_t::dayno(&local_5c);
    vVar2 = create(0,dayno,(int)(local_78 + dVar7 * -86400000.0));
    local_48->typ = VM_OBJ;
    (local_48->val).obj = vVar2;
    sp_ = sp_ + -local_50;
  }
  return 1;
}

Assistant:

int CVmObjDate::getp_addInterval(VMG_ vm_obj_id_t self,
                                 vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(1);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get the interval list */
    vm_val_t *lst = G_stk->get(0);
    if (!lst->is_listlike(vmg0_))
        err_throw(VMERR_BAD_TYPE_BIF);

    /* retrieve my date as a calendar object */
    int32_t dayno = get_ext()->dayno;
    caldate_t cd(dayno);

    /* retrieve my time as a double, to allow for overflows from int32 */
    double daytime = get_ext()->daytime;

    /* add each element from the list */
    int cnt = lst->ll_length(vmg0_);
    for (int i = 1 ; i <= cnt ; ++i)
    {
        /* get this interval element */
        vm_val_t ele;
        lst->ll_index(vmg_ &ele, i);

        /* treat nil as zero */
        if (ele.typ == VM_NIL)
            continue;

        /* add it to the appropriate date or time component */
        switch (i)
        {
        case 1: cd.y += ele.num_to_int(vmg0_); break;
        case 2: cd.m += ele.num_to_int(vmg0_); break;
        case 3: cd.d += ele.num_to_int(vmg0_); break;

        case 4: daytime += ele.num_to_double(vmg0_)*60.*60.*1000.; break;
        case 5: daytime += ele.num_to_double(vmg0_)*60.*1000.; break;
        case 6: daytime += ele.num_to_double(vmg0_)*1000.; break;
        }
    }

    /* carry overflows from the time into the day */
    double day_carry = floor(daytime / (24.*60.*60.*1000.));
    daytime -= day_carry * (24.*60.*60.*1000.);

    if (day_carry + cd.d > INT32MAXVAL || day_carry + cd.d < INT32MINVAL)
        err_throw(VMERR_NUM_OVERFLOW);

    cd.d += (int32_t)day_carry;

    /* return the new date, using our same local timezone */
    retval->set_obj(create(vmg_ FALSE, cd.dayno(), (int32_t)daytime));

    /* discard arguments */
    G_stk->discard(argc);

    /* handled */
    return TRUE;
}